

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_mutex_lock(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict mutex,
               sexp_conflict timeout,sexp_conflict thread)

{
  sexp in_RCX;
  sexp_conflict in_RDI;
  sexp_conflict in_R9;
  sexp_conflict local_38;
  sexp_conflict in_stack_fffffffffffffff8;
  sexp_conflict psVar1;
  
  local_38 = in_R9;
  if (in_R9 == (sexp_conflict)&DAT_0000013e) {
    local_38 = in_RDI;
  }
  if ((in_RCX->value).type.getters == (sexp)0x3e) {
    (in_RCX->value).bytecode.length = 0x13e;
    (in_RCX->value).type.slots = local_38;
    psVar1 = (sexp_conflict)&DAT_0000013e;
  }
  else {
    (in_RDI->value).flonum_bits[0x60a3] = '\x01';
    (in_RDI->value).opcode.dl = in_RCX;
    sexp_insert_timed(thread,in_stack_fffffffffffffff8,in_RDI);
    psVar1 = (sexp_conflict)0x3e;
  }
  return psVar1;
}

Assistant:

sexp sexp_mutex_lock (sexp ctx, sexp self, sexp_sint_t n, sexp mutex, sexp timeout, sexp thread) {
  if (thread == SEXP_TRUE)
    thread = ctx;
  if (sexp_not(sexp_mutex_lockp(mutex))) {
    sexp_mutex_lockp(mutex) = SEXP_TRUE;
    sexp_mutex_thread(mutex) = thread;
    return SEXP_TRUE;
  } else {
    sexp_context_waitp(ctx) = 1;
    sexp_context_event(ctx) = mutex;
    sexp_insert_timed(ctx, ctx, timeout);
    return SEXP_FALSE;
  }
}